

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O0

void __thiscall OpenMD::SimCreator::createMolecules(SimCreator *this,SimInfo *info)

{
  int iVar1;
  SimInfo *in_RSI;
  Molecule *in_stack_00000010;
  SimInfo *in_stack_00000018;
  Molecule *mol;
  int i;
  int stampId;
  MoleculeCreator molCreator;
  LocalIndexManager *in_stack_00000280;
  int in_stack_0000028c;
  MoleculeStamp *in_stack_00000290;
  ForceField *in_stack_00000298;
  MoleculeCreator *in_stack_000002a0;
  ForceField *in_stack_ffffffffffffffb8;
  int globalIndex;
  ForceField *in_stack_ffffffffffffffc0;
  int local_20;
  MoleculeCreator local_18;
  SimInfo *local_10;
  
  local_10 = in_RSI;
  MoleculeCreator::MoleculeCreator(&local_18);
  local_20 = 0;
  while( true ) {
    globalIndex = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    iVar1 = SimInfo::getNGlobalMolecules(local_10);
    if (iVar1 <= local_20) break;
    SimInfo::getMoleculeStampId((SimInfo *)in_stack_ffffffffffffffc0,globalIndex);
    in_stack_ffffffffffffffb8 = SimInfo::getForceField(local_10);
    SimInfo::getMoleculeStamp
              ((SimInfo *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
    ;
    MoleculeCreator::createOverrideAtomTypes(in_stack_000002a0,in_stack_00000298,in_stack_00000290);
    in_stack_ffffffffffffffc0 = SimInfo::getForceField(local_10);
    SimInfo::getMoleculeStamp
              ((SimInfo *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
    ;
    SimInfo::getLocalIndexManager(local_10);
    MoleculeCreator::createMolecule
              (in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_0000028c,
               in_stack_00000280);
    SimInfo::addMolecule(in_stack_00000018,in_stack_00000010);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void SimCreator::createMolecules(SimInfo* info) {
    MoleculeCreator molCreator;
    int stampId;

    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
      stampId       = info->getMoleculeStampId(i);
      molCreator.createOverrideAtomTypes(info->getForceField(),
					 info->getMoleculeStamp(stampId));

#ifdef IS_MPI
      if (info->getMolToProc(i) == worldRank) {
#endif

        Molecule* mol = molCreator.createMolecule(
            info->getForceField(), info->getMoleculeStamp(stampId), i,
            info->getLocalIndexManager());

        info->addMolecule(mol);

#ifdef IS_MPI
      }
#endif
    }
  }